

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::initialize(QApplicationPrivate *this)

{
  QLatin1StringView sep;
  bool bVar1;
  int iVar2;
  QMessageLogger *pQVar3;
  QString *pQVar4;
  QStyle *str;
  QListSpecialMethods<QString> *this_00;
  char *pcVar5;
  ulong uVar6;
  QPlatformTheme *pQVar7;
  long in_RDI;
  long in_FS_OFFSET;
  QPlatformTheme *theme;
  QStyle *style;
  QString *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  char *in_stack_ffffffffffffff18;
  QStyle *in_stack_ffffffffffffff48;
  QString local_a8 [3];
  char local_60 [56];
  QVariant local_28;
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  pQVar3 = (QMessageLogger *)operator_new(8);
  QHash<unsigned_long_long,_QWidget_*>::QHash((QHash<unsigned_long_long,_QWidget_*> *)pQVar3);
  QWidgetPrivate::mapper = (QWidgetMapper *)pQVar3;
  pQVar3 = (QMessageLogger *)QWidgetPrivate::mapper;
  pQVar4 = (QString *)operator_new(8);
  QSet<QWidget_*>::QSet((QSet<QWidget_*> *)0x2c9972);
  QWidgetPrivate::allWidgets = (QWidgetSet *)pQVar4;
  pQVar4 = (QString *)QWidgetPrivate::allWidgets;
  qRegisterWidgetsVariant();
  QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;
  if (*(char *)(in_RDI + 0x90) != '\0') {
    bVar1 = QString::isEmpty((QString *)0x2c99b8);
    if (!bVar1) {
      QString::toLower(in_stack_fffffffffffffee8);
      str = QStyleFactory::create((QString *)pQVar3);
      QString::~QString((QString *)0x2c99f3);
      if (str == (QStyle *)0x0) {
        QMessageLogger::QMessageLogger(pQVar3,(char *)0x0,iVar2,(char *)in_stack_fffffffffffffee8);
        QtPrivate::asString((QString *)&QGuiApplicationPrivate::styleOverride);
        QString::toLocal8Bit(pQVar4);
        this_00 = (QListSpecialMethods<QString> *)QByteArray::constData((QByteArray *)0x2c9a53);
        QStyleFactory::keys();
        Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)this_00);
        sep.m_data = in_stack_ffffffffffffff18;
        sep.m_size = in_RDI;
        QListSpecialMethods<QString>::join(this_00,sep);
        QtPrivate::asString(local_a8);
        QString::toLocal8Bit(pQVar4);
        pcVar5 = QByteArray::constData((QByteArray *)0x2c9abd);
        QMessageLogger::warning
                  (local_60,
                   "QApplication: invalid style override \'%s\' passed, ignoring it.\n\tAvailable styles: %s"
                   ,this_00,pcVar5);
        QByteArray::~QByteArray((QByteArray *)0x2c9ae8);
        QString::~QString((QString *)0x2c9af2);
        QList<QString>::~QList((QList<QString> *)0x2c9afc);
        QByteArray::~QByteArray((QByteArray *)0x2c9b09);
        QString::clear((QString *)this_00);
      }
      else {
        QApplication::setStyle(in_stack_ffffffffffffff48);
      }
    }
    QApplication::style();
  }
  iVar2 = qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS",(bool *)0x0);
  if (0 < iVar2) {
    QCoreApplication::setAttribute(AA_NativeWindows,true);
  }
  if ((qt_is_tty_app & 1) == 0) {
    initializeMultitouch((QApplicationPrivate *)0x2c9b56);
  }
  uVar6 = QGuiApplication::desktopSettingsAware();
  if (((uVar6 & 1) != 0) &&
     (pQVar7 = QGuiApplicationPrivate::platformTheme(), pQVar7 != (QPlatformTheme *)0x0)) {
    (**(code **)(*(long *)pQVar7 + 0x60))(&local_28,pQVar7,0x17);
    enabledAnimations = ::QVariant::toInt((bool *)&local_28);
    ::QVariant::~QVariant(&local_28);
  }
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::initialize()
{
    is_app_running = false; // Starting up.

    QWidgetPrivate::mapper = new QWidgetMapper;
    QWidgetPrivate::allWidgets = new QWidgetSet;

    // needed for a static build.
    qRegisterWidgetsVariant();

    // needed for widgets in QML
    QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;

    if (application_type != QApplicationPrivate::Tty) {
        if (!styleOverride.isEmpty()) {
            if (auto *style = QStyleFactory::create(styleOverride.toLower())) {
                QApplication::setStyle(style);
            } else {
                qWarning("QApplication: invalid style override '%s' passed, ignoring it.\n"
                    "\tAvailable styles: %s", qPrintable(styleOverride),
                    qPrintable(QStyleFactory::keys().join(", "_L1)));
                // Clear styleOverride so it is not picked by Qt Quick Controls (QTBUG-100563)
                styleOverride.clear();
            }
        }

        // Trigger default style if none was set already
        Q_UNUSED(QApplication::style());
    }

    if (qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS") > 0)
        QCoreApplication::setAttribute(Qt::AA_NativeWindows);

    if (!qt_is_tty_app)
        initializeMultitouch();

    if (QGuiApplication::desktopSettingsAware())
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
            QApplicationPrivate::enabledAnimations = theme->themeHint(QPlatformTheme::UiEffects).toInt();
        }

    is_app_running = true; // no longer starting up
}